

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

bool __thiscall
MetaCommand::AddField
          (MetaCommand *this,string *name,string *description,TypeEnumType type,
          DataEnumType externalData,string *rangeMin,string *rangeMax)

{
  Option option;
  Field field;
  undefined1 local_160 [32];
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> local_100;
  bool local_e8;
  undefined2 local_e7;
  undefined1 local_e0 [104];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  local_160._0_8_ = local_160 + 0x10;
  local_160._8_8_ = 0;
  local_160[0x10] = '\0';
  local_140._M_p = (pointer)&local_130;
  local_138 = 0;
  local_130._M_local_buf[0] = '\0';
  local_120._M_p = (pointer)&local_110;
  local_118 = 0;
  local_110._M_local_buf[0] = '\0';
  local_100.super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)&local_120,0,(char *)0x0,0x16b513);
  local_e0._0_8_ = local_e0 + 0x10;
  local_e0._8_8_ = 0;
  local_e0[0x10] = '\0';
  local_e0._32_8_ = local_e0 + 0x30;
  local_e0._40_8_ = 0;
  local_e0[0x30] = '\0';
  local_e0._64_8_ = local_e0 + 0x50;
  local_e0._72_8_ = 0;
  local_e0[0x50] = '\0';
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_assign((string *)local_e0);
  local_38._0_1_ = true;
  local_38._1_1_ = false;
  local_e0._96_4_ = type;
  local_e0._100_4_ = externalData;
  std::__cxx11::string::_M_assign((string *)&local_78);
  std::__cxx11::string::_M_assign((string *)&local_58);
  std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::push_back
            (&local_100,(value_type *)local_e0);
  local_e8 = true;
  std::__cxx11::string::_M_assign((string *)local_160);
  std::__cxx11::string::_M_assign((string *)&local_140);
  local_e7._0_1_ = false;
  local_e7._1_1_ = false;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
            (&this->m_OptionVector,(value_type *)local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p);
  }
  if ((undefined1 *)local_e0._64_8_ != local_e0 + 0x50) {
    operator_delete((void *)local_e0._64_8_);
  }
  if ((undefined1 *)local_e0._32_8_ != local_e0 + 0x30) {
    operator_delete((void *)local_e0._32_8_);
  }
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_);
  }
  std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::~vector(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_p != &local_110) {
    operator_delete(local_120._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != &local_130) {
    operator_delete(local_140._M_p);
  }
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_);
  }
  return true;
}

Assistant:

bool MetaCommand::AddField(METAIO_STL::string name,
                           METAIO_STL::string description,
                           TypeEnumType type,
                           DataEnumType externalData,
                           METAIO_STL::string rangeMin,
                           METAIO_STL::string rangeMax)
{
  // need to add some tests here to check if the option is not defined yet
  Option option;
  option.tag = "";

  // Create a field without description with the specified type
  Field field;
  field.name = name;
  field.type = type;
  field.required = true;
  field.userDefined = false;
  field.externaldata = externalData;
  field.rangeMin = rangeMin;
  field.rangeMax = rangeMax;
  option.fields.push_back(field);

  option.required = true;
  option.name = name;
  option.description = description;
  option.userDefined = false;
  option.complete = false;

  m_OptionVector.push_back(option);
  return true;
}